

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::python::Generator::CopyPublicDependenciesAliases
          (Generator *this,string_view copy_from,FileDescriptor *file)

{
  string_view copy_from_00;
  FileDescriptor *pFVar1;
  FileDescriptor *file_00;
  long lVar2;
  string_view filename;
  string_view filename_00;
  string_view text;
  string_view copy_from_local;
  string module_name;
  string module_alias;
  
  copy_from_local._M_str = copy_from._M_str;
  copy_from_local._M_len = copy_from._M_len;
  if (0 < file->public_dependency_count_) {
    lVar2 = 0;
    file_00 = file;
    do {
      pFVar1 = FileDescriptor::dependency(file,file->public_dependencies_[lVar2]);
      filename._M_str = (char *)file_00;
      filename._M_len = (size_t)(pFVar1->name_->_M_dataplus)._M_p;
      ModuleName_abi_cxx11_(&module_name,(python *)pFVar1->name_->_M_string_length,filename);
      pFVar1 = FileDescriptor::dependency(file,file->public_dependencies_[lVar2]);
      filename_00._M_str = (char *)file_00;
      filename_00._M_len = (size_t)(pFVar1->name_->_M_dataplus)._M_p;
      python::(anonymous_namespace)::ModuleAlias_abi_cxx11_
                (&module_alias,(_anonymous_namespace_ *)pFVar1->name_->_M_string_length,filename_00)
      ;
      text._M_str = 
      "try:\n  $alias$ = $copy_from$.$alias$\nexcept AttributeError:\n  $alias$ = $copy_from$.$module$\n"
      ;
      text._M_len = 0x5d;
      io::Printer::
      Print<char[6],std::__cxx11::string,char[7],std::__cxx11::string,char[10],std::basic_string_view<char,std::char_traits<char>>>
                (this->printer_,text,(char (*) [6])0x54c90c,&module_alias,(char (*) [7])0x5615f3,
                 &module_name,(char (*) [10])0x5f0de7,&copy_from_local);
      copy_from_00._M_str = copy_from_local._M_str;
      copy_from_00._M_len = copy_from_local._M_len;
      file_00 = FileDescriptor::dependency(file,file->public_dependencies_[lVar2]);
      CopyPublicDependenciesAliases(this,copy_from_00,file_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)module_alias._M_dataplus._M_p != &module_alias.field_2) {
        operator_delete(module_alias._M_dataplus._M_p,module_alias.field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)module_name._M_dataplus._M_p != &module_name.field_2) {
        operator_delete(module_name._M_dataplus._M_p,module_name.field_2._M_allocated_capacity + 1);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < file->public_dependency_count_);
  }
  return;
}

Assistant:

void Generator::CopyPublicDependenciesAliases(
    absl::string_view copy_from, const FileDescriptor* file) const {
  for (int i = 0; i < file->public_dependency_count(); ++i) {
    std::string module_name = ModuleName(file->public_dependency(i)->name());
    std::string module_alias = ModuleAlias(file->public_dependency(i)->name());
    // There's no module alias in the dependent file if it was generated by
    // an old protoc (less than 3.0.0-alpha-1). Use module name in this
    // situation.
    printer_->Print(
        "try:\n"
        "  $alias$ = $copy_from$.$alias$\n"
        "except AttributeError:\n"
        "  $alias$ = $copy_from$.$module$\n",
        "alias", module_alias, "module", module_name, "copy_from", copy_from);
    CopyPublicDependenciesAliases(copy_from, file->public_dependency(i));
  }
}